

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>,mpl_::bool_<false>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,long *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  
  pcVar1 = (state->cur_)._M_current;
  uVar4 = 0xffffffff;
  do {
    if (*(uint *)(this + 4) <= uVar4 + 1) goto LAB_0012ad3d;
    bVar2 = matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>
            ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>
                        *)this,state);
    uVar4 = uVar4 + 1;
  } while (bVar2);
LAB_0012ad51:
  (state->cur_)._M_current = pcVar1;
  return false;
LAB_0012ad3d:
  do {
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    if (cVar3 != '\0') {
      return true;
    }
    uVar4 = uVar4 + 1;
  } while ((uVar4 < *(uint *)(this + 8)) &&
          (bVar2 = matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>
                   ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             ((matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>
                               *)this,state), bVar2));
  goto LAB_0012ad51;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }